

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashtbl.c
# Opt level: O0

void test_hashtbl_set_get(void)

{
  cf_hashtbl_t *self;
  cf_size_t cVar1;
  int *piVar2;
  cf_hashtbl_t *tbl;
  cf_size_t cnt;
  cf_size_t i;
  int values [4];
  int keys [4];
  
  values[2] = 0x1234;
  values[3] = 0x5678;
  values[0] = 3;
  values[1] = 4;
  self = cf_hashtbl_new(0xf,cb);
  for (cnt = 0; cnt < 4; cnt = cnt + 1) {
    cf_hashtbl_set(self,values + cnt + 2,4,values + (cnt - 2));
  }
  cVar1 = cf_hashtbl_size(self);
  if (cVar1 == 4) {
    cnt = 0;
    while( true ) {
      if (3 < cnt) {
        cf_hashtbl_delete(self);
        return;
      }
      piVar2 = (int *)cf_hashtbl_get(self,values + cnt + 2,4);
      if (*piVar2 != values[cnt - 2]) break;
      cnt = cnt + 1;
    }
    __assert_fail("*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_hashtbl.c"
                  ,0x16,"void test_hashtbl_set_get()");
  }
  __assert_fail("cf_hashtbl_size(tbl) == cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_hashtbl.c"
                ,0x13,"void test_hashtbl_set_get()");
}

Assistant:

void test_hashtbl_set_get() {
    int keys[] = {0x1234, 0x5678, 0x9abc, 0xdef0};
    int values[] = {1, 2, 3, 4};
    cf_size_t i, cnt = 4;
    cf_hashtbl_t* tbl = cf_hashtbl_new(15, cb);
    for (i = 0; i < cnt; i++) {
        cf_hashtbl_set(tbl, &keys[i], sizeof(int), &values[i]);
    }

    cf_assert(cf_hashtbl_size(tbl) == cnt);

    for (i = 0; i < cnt; i++) {
        cf_assert(*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]);
    }
    cf_hashtbl_delete(tbl);
}